

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font * nk_font_atlas_add_compressed_base85
                    (nk_font_atlas *atlas,char *data_base85,float height,nk_font_config *config)

{
  int iVar1;
  uchar *src;
  char *in_RSI;
  long in_RDI;
  nk_font *font;
  void *compressed_data;
  int compressed_size;
  nk_font_config *in_stack_00000078;
  float in_stack_00000084;
  nk_size in_stack_00000088;
  void *in_stack_00000090;
  nk_font_atlas *in_stack_00000098;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  if ((((in_RDI == 0) || (in_RSI == (char *)0x0)) || (*(long *)(in_RDI + 0x30) == 0)) ||
     (((*(long *)(in_RDI + 0x38) == 0 || (*(long *)(in_RDI + 0x18) == 0)) ||
      (*(long *)(in_RDI + 0x20) == 0)))) {
    local_8 = (nk_font *)0x0;
  }
  else {
    iVar1 = nk_strlen(in_RSI);
    iVar1 = (iVar1 + 4) / 5 << 2;
    src = (uchar *)(**(code **)(in_RDI + 0x30))(*(undefined8 *)(in_RDI + 0x28),0,(long)iVar1);
    if (src == (uchar *)0x0) {
      local_8 = (nk_font *)0x0;
    }
    else {
      nk_decode_85((uchar *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),src);
      local_8 = nk_font_atlas_add_compressed
                          (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000084,
                           in_stack_00000078);
      (**(code **)(in_RDI + 0x38))(*(undefined8 *)(in_RDI + 0x28),src);
    }
  }
  return local_8;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed_base85(struct nk_font_atlas *atlas,
const char *data_base85, float height, const struct nk_font_config *config)
{
int compressed_size;
void *compressed_data;
struct nk_font *font;

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);

NK_ASSERT(data_base85);
if (!atlas || !data_base85 || !atlas->temporary.alloc || !atlas->temporary.free ||
!atlas->permanent.alloc || !atlas->permanent.free)
return 0;

compressed_size = (((int)nk_strlen(data_base85) + 4) / 5) * 4;
compressed_data = atlas->temporary.alloc(atlas->temporary.userdata,0, (nk_size)compressed_size);
NK_ASSERT(compressed_data);
if (!compressed_data) return 0;
nk_decode_85((unsigned char*)compressed_data, (const unsigned char*)data_base85);
font = nk_font_atlas_add_compressed(atlas, compressed_data,
(nk_size)compressed_size, height, config);
atlas->temporary.free(atlas->temporary.userdata, compressed_data);
return font;
}